

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O2

longlong GeneratedSaxParser::Utils::toInteger<long_long,true>(ParserChar *buffer,bool *failed)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  ParserChar *s;
  byte *pbVar5;
  long lStack_8;
  
  if ((buffer != (ParserChar *)0x0) && (bVar1 = *buffer, bVar1 != 0)) {
    pbVar5 = (byte *)(buffer + 1);
    do {
      uVar2 = (ulong)bVar1;
      if (0x2d < bVar1) {
LAB_008430b2:
        pbVar5 = pbVar5 + -1;
LAB_008430b5:
        lStack_8 = 1;
LAB_008430b7:
        lVar3 = 0;
        bVar4 = false;
        goto LAB_008430bc;
      }
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0x2b) goto LAB_008430b5;
        if (uVar2 != 0x2d) goto LAB_008430b2;
        lStack_8 = -1;
        goto LAB_008430b7;
      }
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar1 != 0);
  }
LAB_0084309c:
  *failed = true;
  return 0;
LAB_008430bc:
  bVar1 = *pbVar5;
  if ((ulong)bVar1 == 0) {
LAB_008430e6:
    *failed = false;
    return lVar3 * lStack_8;
  }
  if (9 < (byte)(bVar1 - 0x30)) {
    if (!bVar4) goto LAB_0084309c;
    goto LAB_008430e6;
  }
  lVar3 = lVar3 * 10 + (ulong)bVar1 + -0x30;
  pbVar5 = pbVar5 + 1;
  bVar4 = true;
  goto LAB_008430bc;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}